

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O2

int CVAhermiteGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  CVadjMemRec *pCVar1;
  CVdtpntMemRec **ppCVar2;
  undefined8 *puVar3;
  sunrealtype *psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  undefined8 local_100;
  int newpoint;
  double local_f0;
  double local_e8;
  N_Vector local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c0;
  undefined8 local_b8;
  long indx;
  undefined8 local_a8;
  double dStack_a0;
  undefined8 local_98;
  double local_90;
  undefined4 local_88;
  uint uStack_84;
  undefined4 uStack_80;
  uint uStack_7c;
  undefined8 local_78;
  undefined8 local_70;
  N_Vector *local_68;
  N_Vector *pp_Stack_60;
  undefined8 local_58;
  undefined8 local_50;
  N_Vector local_48;
  N_Vector p_Stack_40;
  
  pCVar1 = cv_mem->cv_adj_mem;
  uVar10 = 0;
  if ((yS != (N_Vector *)0x0) && (uVar10 = 0, pCVar1->ca_IMinterpSensi != 0)) {
    uVar10 = cv_mem->cv_Ns;
  }
  ppCVar2 = pCVar1->dt_mem;
  local_e0 = y;
  iVar8 = CVAfindIndex(cv_mem,t,&indx,&newpoint);
  if (iVar8 != 0) {
    return iVar8;
  }
  if (indx == 0) {
    puVar3 = (undefined8 *)(*ppCVar2)->content;
    N_VScale(0,*puVar3,local_e0);
    if (0 < (int)uVar10) {
      psVar4 = cv_mem->cv_cvals;
      for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        psVar4[uVar9] = 1.0;
      }
      iVar8 = N_VScaleVectorArray(uVar10,cv_mem->cv_cvals,puVar3[2],yS);
      if (iVar8 != 0) {
        return -0x1c;
      }
    }
  }
  else {
    dVar13 = ppCVar2[indx + -1]->t;
    dVar12 = ppCVar2[indx]->t;
    puVar3 = (undefined8 *)ppCVar2[indx + -1]->content;
    if (pCVar1->ca_IMinterpSensi == 0) {
      uVar11 = 0;
      local_100 = 0;
    }
    else {
      local_100 = puVar3[2];
      uVar11 = puVar3[3];
    }
    local_98 = dVar12 - dVar13;
    uVar5 = *puVar3;
    uVar6 = puVar3[1];
    local_90 = local_98;
    if (newpoint != 0) {
      puVar3 = (undefined8 *)ppCVar2[indx]->content;
      uVar7 = *puVar3;
      local_48 = (N_Vector)puVar3[1];
      local_a8 = 0xc000000000000000;
      dStack_a0 = 2.0;
      uStack_d0 = 0;
      local_f0 = dVar13;
      local_e8 = dVar12;
      local_d8 = local_98;
      local_b8 = uVar11;
      local_58 = uVar7;
      local_50 = uVar5;
      p_Stack_40 = (N_Vector)uVar6;
      iVar8 = N_VLinearCombination(4,&local_a8,&local_58,pCVar1->ca_Y[1]);
      if (iVar8 != 0) {
        return -0x1c;
      }
      local_a8 = 0x3ff0000000000000;
      dStack_a0 = -1.0;
      uStack_84 = local_d8._4_4_ ^ 0x80000000;
      uStack_7c = uStack_d0._4_4_ ^ 0x80000000;
      local_88 = (undefined4)local_d8;
      uStack_80 = (undefined4)uStack_d0;
      local_98 = -local_d8;
      local_58 = uVar7;
      local_50 = uVar5;
      local_48 = (N_Vector)uVar6;
      iVar8 = N_VLinearCombination(3,&local_a8,&local_58,pCVar1->ca_Y[0]);
      uVar11 = local_b8;
      if (iVar8 != 0) {
        return -0x1c;
      }
      dVar12 = local_e8;
      local_90 = local_d8;
      dVar13 = local_f0;
      if (0 < (int)uVar10) {
        local_c0 = puVar3[2];
        local_68 = (N_Vector *)puVar3[3];
        local_a8 = 0xc000000000000000;
        dStack_a0 = 2.0;
        local_70 = local_100;
        local_98 = local_d8;
        pp_Stack_60 = (N_Vector *)local_b8;
        local_78 = local_c0;
        iVar8 = N_VLinearCombinationVectorArray(uVar10,4,&local_a8,&local_78,pCVar1->ca_YS[1]);
        if (iVar8 != 0) {
          return -0x1c;
        }
        local_78 = local_c0;
        local_a8 = 0x3ff0000000000000;
        dStack_a0 = -1.0;
        local_70 = local_100;
        local_98 = (double)CONCAT44(uStack_84,local_88);
        local_68 = (N_Vector *)uVar11;
        iVar8 = N_VLinearCombinationVectorArray(uVar10,3,&local_a8,&local_78,pCVar1->ca_YS[0]);
        dVar12 = local_e8;
        local_90 = local_d8;
        dVar13 = local_f0;
        if (iVar8 != 0) {
          return -0x1c;
        }
      }
    }
    dStack_a0 = t - dVar13;
    local_a8 = 0x3ff0000000000000;
    local_98 = (dStack_a0 / local_90) * (dStack_a0 / local_90);
    local_90 = ((t - dVar12) * local_98) / local_90;
    local_48 = pCVar1->ca_Y[0];
    p_Stack_40 = pCVar1->ca_Y[1];
    local_58 = uVar5;
    local_50 = uVar6;
    iVar8 = N_VLinearCombination(4,&local_a8,&local_58,local_e0);
    if (iVar8 != 0) {
      return -0x1c;
    }
    if (0 < (int)uVar10) {
      local_78 = local_100;
      local_68 = pCVar1->ca_YS[0];
      pp_Stack_60 = pCVar1->ca_YS[1];
      local_70 = uVar11;
      iVar8 = N_VLinearCombinationVectorArray(uVar10,4,&local_a8,&local_78,yS);
      if (iVar8 != 0) {
        return -0x1c;
      }
    }
  }
  return 0;
}

Assistant:

static int CVAhermiteGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y, N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVhermiteDataMem content0, content1;

  sunrealtype t0, t1, delta;
  sunrealtype factor1, factor2, factor3;

  N_Vector y0, yd0, y1, yd1;
  N_Vector *yS0 = NULL, *ySd0 = NULL, *yS1, *ySd1;

  int flag, is, NS;
  long int indx;
  sunbooleantype newpoint;

  /* local variables for fused vector oerations */
  int retval;
  sunrealtype cvals[4];
  N_Vector Xvecs[4];
  N_Vector* XXvecs[4];

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &indx, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (indx == 0)
  {
    content0 = (CVhermiteDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content0->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content0->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Extract stuff from the appropriate data points */

  t0    = dt_mem[indx - 1]->t;
  t1    = dt_mem[indx]->t;
  delta = t1 - t0;

  content0 = (CVhermiteDataMem)(dt_mem[indx - 1]->content);
  y0       = content0->y;
  yd0      = content0->yd;
  if (ca_mem->ca_IMinterpSensi)
  {
    yS0  = content0->yS;
    ySd0 = content0->ySd;
  }

  if (newpoint)
  {
    /* Recompute Y0 and Y1 */

    content1 = (CVhermiteDataMem)(dt_mem[indx]->content);

    y1  = content1->y;
    yd1 = content1->yd;

    /* Y1 = delta (yd1 + yd0) - 2 (y1 - y0) */
    cvals[0] = -TWO;
    Xvecs[0] = y1;
    cvals[1] = TWO;
    Xvecs[1] = y0;
    cvals[2] = delta;
    Xvecs[2] = yd1;
    cvals[3] = delta;
    Xvecs[3] = yd0;

    retval = N_VLinearCombination(4, cvals, Xvecs, ca_mem->ca_Y[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    /* Y0 = y1 - y0 - delta * yd0 */
    cvals[0] = ONE;
    Xvecs[0] = y1;
    cvals[1] = -ONE;
    Xvecs[1] = y0;
    cvals[2] = -delta;
    Xvecs[2] = yd0;

    retval = N_VLinearCombination(3, cvals, Xvecs, ca_mem->ca_Y[0]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    /* Recompute YS0 and YS1, if needed */

    if (NS > 0)
    {
      yS1  = content1->yS;
      ySd1 = content1->ySd;

      /* YS1 = delta (ySd1 + ySd0) - 2 (yS1 - yS0) */
      cvals[0]  = -TWO;
      XXvecs[0] = yS1;
      cvals[1]  = TWO;
      XXvecs[1] = yS0;
      cvals[2]  = delta;
      XXvecs[2] = ySd1;
      cvals[3]  = delta;
      XXvecs[3] = ySd0;

      retval = N_VLinearCombinationVectorArray(NS, 4, cvals, XXvecs,
                                               ca_mem->ca_YS[1]);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

      /* YS0 = yS1 - yS0 - delta * ySd0 */
      cvals[0]  = ONE;
      XXvecs[0] = yS1;
      cvals[1]  = -ONE;
      XXvecs[1] = yS0;
      cvals[2]  = -delta;
      XXvecs[2] = ySd0;

      retval = N_VLinearCombinationVectorArray(NS, 3, cvals, XXvecs,
                                               ca_mem->ca_YS[0]);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }
  }

  /* Perform the actual interpolation. */

  factor1 = t - t0;

  factor2 = factor1 / delta;
  factor2 = factor2 * factor2;

  factor3 = factor2 * (t - t1) / delta;

  cvals[0] = ONE;
  cvals[1] = factor1;
  cvals[2] = factor2;
  cvals[3] = factor3;

  /* y = y0 + factor1 yd0 + factor2 * Y[0] + factor3 Y[1] */
  Xvecs[0] = y0;
  Xvecs[1] = yd0;
  Xvecs[2] = ca_mem->ca_Y[0];
  Xvecs[3] = ca_mem->ca_Y[1];

  retval = N_VLinearCombination(4, cvals, Xvecs, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* yS = yS0 + factor1 ySd0 + factor2 * YS[0] + factor3 YS[1], if needed */
  if (NS > 0)
  {
    XXvecs[0] = yS0;
    XXvecs[1] = ySd0;
    XXvecs[2] = ca_mem->ca_YS[0];
    XXvecs[3] = ca_mem->ca_YS[1];

    retval = N_VLinearCombinationVectorArray(NS, 4, cvals, XXvecs, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}